

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_err_t bpptree_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_bpp_open_t info_00;
  int iVar1;
  ion_bpp_err_t iVar2;
  ion_dictionary_parent_t *piVar3;
  ion_file_handle_t pFVar4;
  ion_bpp_err_t bErr;
  int actual_filename_length;
  char addr_filename [12];
  char value_filename [20];
  ion_bpp_open_t info;
  ion_bpptree_t *bpptree;
  ion_dictionary_compare_t compare_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  
  piVar3 = (ion_dictionary_parent_t *)malloc(0x38);
  if (piVar3 == (ion_dictionary_parent_t *)0x0) {
    key_type_local._3_1_ = 6;
  }
  else {
    bpptree_get_filename(id,addr_filename + 4);
    pFVar4 = ion_fopen(addr_filename + 4);
    *(ion_file_handle_t *)&piVar3[1].record.value_size = pFVar4;
    piVar3[1].compare = (ion_dictionary_compare_t)0xffffffffffffffff;
    iVar1 = dictionary_get_filename(id,"bpt",(char *)&bErr);
    if (iVar1 < 0xc) {
      info_00.keySize = key_size;
      info_00.iName = (char *)&bErr;
      info_00.dupKeys = 0;
      info_00.sectorSize = 0x100;
      info_00.comp = compare;
      iVar2 = b_open(info_00,(ion_bpp_handle_t *)(piVar3 + 1));
      if (iVar2 == bErrOk) {
        if (handler == (ion_dictionary_handler_t *)0x0) {
          key_type_local._3_1_ = 0x12;
        }
        else {
          dictionary->instance = piVar3;
          dictionary->instance->compare = compare;
          dictionary->instance->key_type = key_type;
          (dictionary->instance->record).key_size = key_size;
          (dictionary->instance->record).value_size = value_size;
          dictionary->instance->type = dictionary_type_bpp_tree_t;
          dictionary->handler = handler;
          key_type_local._3_1_ = key_type_numeric_signed >> 0x18;
        }
      }
      else {
        key_type_local._3_1_ = 0x12;
      }
    }
    else {
      key_type_local._3_1_ = 0x12;
    }
  }
  return key_type_local._3_1_;
}

Assistant:

ion_err_t
bpptree_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(dictionary_size);

/*	if (key_size != sizeof(int)) {
		return err_invalid_initial_size;
	}*/

	ion_bpptree_t	*bpptree;
	ion_bpp_open_t	info;

	bpptree = malloc(sizeof(ion_bpptree_t));

	if (NULL == bpptree) {
		return err_out_of_memory;
	}

	char value_filename[20];

	bpptree_get_filename(id, value_filename);
	bpptree->values.file_handle = ion_fopen(value_filename);

	bpptree->values.next_empty	= ION_FILE_NULL;

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(id, "bpt", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	info.iName		= addr_filename;
	info.keySize	= key_size;
	info.dupKeys	= boolean_false;
	info.sectorSize = 256;
	info.comp		= compare;

	ion_bpp_err_t bErr = b_open(info, &(bpptree->tree));

	if (bErrOk != bErr) {
		return err_uninitialized;
	}

	if (NULL == handler) {
		return err_uninitialized;
	}

	dictionary->instance					= (ion_dictionary_parent_t *) bpptree;
	dictionary->instance->compare			= compare;
	dictionary->instance->key_type			= key_type;
	dictionary->instance->record.key_size	= key_size;
	dictionary->instance->record.value_size = value_size;
	dictionary->instance->type				= dictionary_type_bpp_tree_t;
	dictionary->handler						= handler;

	return err_ok;
}